

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O0

bool __thiscall
Js::SerializationCloner<Js::StreamWriter>::TryClonePrimitive
          (SerializationCloner<Js::StreamWriter> *this,SrcTypeId typeId,Src src,Dst *dst)

{
  StreamWriter *pSVar1;
  BOOL BVar2;
  JavascriptBoolean *this_00;
  JavascriptTypedNumber<long> *this_01;
  JavascriptTypedNumber<unsigned_long> *this_02;
  SCATypeId typeId_00;
  unsigned_long local_50;
  long local_48;
  double local_40;
  int32 local_34;
  Dst *local_30;
  Dst *dst_local;
  Src src_local;
  SerializationCloner<Js::StreamWriter> *pSStack_18;
  SrcTypeId typeId_local;
  SerializationCloner<Js::StreamWriter> *this_local;
  
  local_30 = dst;
  dst_local = (Dst *)src;
  src_local._4_4_ = typeId;
  pSStack_18 = this;
  switch(typeId) {
  case TypeIds_Undefined:
    WriteTypeId(this,SCA_UndefinedValue);
    break;
  case TypeIds_Null:
    WriteTypeId(this,SCA_NullValue);
    break;
  case TypeIds_Boolean:
    this_00 = VarTo<Js::JavascriptBoolean>(src);
    BVar2 = JavascriptBoolean::GetValue(this_00);
    typeId_00 = SCA_FalseValue;
    if (BVar2 != 0) {
      typeId_00 = SCA_TrueValue;
    }
    WriteTypeId(this,typeId_00);
    break;
  case TypeIds_FirstNumberType:
    WriteTypeId(this,SCA_Int32Value);
    pSVar1 = this->m_writer;
    local_34 = TaggedInt::ToInt32(dst_local);
    StreamWriter::Write<int>(pSVar1,&local_34);
    break;
  case TypeIds_Number:
    WriteTypeId(this,SCA_DoubleValue);
    pSVar1 = this->m_writer;
    local_40 = JavascriptNumber::GetValue(dst_local);
    StreamWriter::Write<double>(pSVar1,&local_40);
    break;
  case TypeIds_Int64Number:
    WriteTypeId(this,SCA_Int64Value);
    pSVar1 = this->m_writer;
    this_01 = VarTo<Js::JavascriptTypedNumber<long>>(dst_local);
    local_48 = JavascriptTypedNumber<long>::GetValue(this_01);
    StreamWriter::Write<long>(pSVar1,&local_48);
    break;
  case TypeIds_LastNumberType:
    WriteTypeId(this,SCA_LastPrimitive);
    pSVar1 = this->m_writer;
    this_02 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(dst_local);
    local_50 = JavascriptTypedNumber<unsigned_long>::GetValue(this_02);
    StreamWriter::Write<unsigned_long>(pSVar1,&local_50);
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool SerializationCloner<Writer>::TryClonePrimitive(SrcTypeId typeId, Src src, Dst* dst)
    {
        switch (typeId)
        {
        case TypeIds_Undefined:
            WriteTypeId(SCA_UndefinedValue);
            break;

        case TypeIds_Null:
            WriteTypeId(SCA_NullValue);
            break;

        case TypeIds_Boolean:
            WriteTypeId(
                VarTo<JavascriptBoolean>(src)->GetValue() ? SCA_TrueValue : SCA_FalseValue);
            break;

        case TypeIds_Integer:
            {
                WriteTypeId(SCA_Int32Value);
                m_writer->Write(TaggedInt::ToInt32(src));
            }
            break;

        case TypeIds_Number:
            {
                WriteTypeId(SCA_DoubleValue);
                m_writer->Write(JavascriptNumber::GetValue(src));
            }
            break;

        case TypeIds_Int64Number:
            {
                WriteTypeId(SCA_Int64Value);
                m_writer->Write(VarTo<JavascriptInt64Number>(src)->GetValue());
            }
            break;

        case TypeIds_UInt64Number:
            {
                WriteTypeId(SCA_Uint64Value);
                m_writer->Write(VarTo<JavascriptUInt64Number>(src)->GetValue());
            }
            break;

        default:
            return false; // Not a recognized primitive type
        }

        return true;
    }